

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_listener_close(nng_listener lid)

{
  int iVar1;
  nni_listener *in_RAX;
  nni_listener *local_18;
  nni_listener *l;
  
  local_18 = in_RAX;
  iVar1 = nni_listener_find(&local_18,lid.id);
  if (iVar1 == 0) {
    nni_listener_close(local_18);
  }
  return iVar1;
}

Assistant:

int
nng_listener_close(nng_listener lid)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	nni_listener_close(l);
	return (0);
}